

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

MemoryInstanceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemoryInstanceInfo
          (MemoryInstanceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  long lVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  size_t *psVar4;
  char *pcVar5;
  Name NVar6;
  Name NVar7;
  Name NVar8;
  
  pcVar3 = name.super_IString.str._M_str;
  pcVar5 = name.super_IString.str._M_len;
  NVar6.super_IString.str._M_str = pcVar5;
  NVar6.super_IString.str._M_len = (size_t)this->wasm;
  lVar1 = wasm::Module::getMemory(NVar6);
  if (*(long *)(lVar1 + 0x20) != 0) {
    do {
      pmVar2 = std::
               map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
               ::at(&this->linkedInstances,(key_type *)(lVar1 + 0x18));
      NVar7.super_IString.str._M_str = *(char **)(lVar1 + 0x28);
      NVar7.super_IString.str._M_len =
           (size_t)(((pmVar2->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
      lVar1 = wasm::Module::getExport(NVar7);
      psVar4 = (size_t *)(lVar1 + 0x18);
      if (*(char *)(lVar1 + 0x28) != '\0') {
        psVar4 = (size_t *)0x0;
      }
      this = &((pmVar2->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_ModuleRunnerBase<wasm::ModuleRunner>;
      pcVar5 = (char *)*psVar4;
      pcVar3 = (char *)psVar4[1];
      NVar8.super_IString.str._M_str = pcVar5;
      NVar8.super_IString.str._M_len = (size_t)this->wasm;
      lVar1 = wasm::Module::getMemory(NVar8);
    } while (*(long *)(lVar1 + 0x20) != 0);
  }
  __return_storage_ptr__->instance = (ModuleRunner *)this;
  (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)pcVar5;
  (__return_storage_ptr__->name).super_IString.str._M_str = pcVar3;
  return __return_storage_ptr__;
}

Assistant:

MemoryInstanceInfo getMemoryInstanceInfo(Name name) {
    auto* memory = wasm.getMemory(name);
    if (memory->imported()) {
      auto& importedInstance = linkedInstances.at(memory->module);
      auto* memoryExport = importedInstance->wasm.getExport(memory->base);
      return importedInstance->getMemoryInstanceInfo(
        *memoryExport->getInternalName());
    }

    return MemoryInstanceInfo{self(), name};
  }